

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O3

int __thiscall Vector::copy(Vector *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  reference_wrapper<const_Typelib::Type> rVar2;
  long lVar3;
  EVP_PKEY_CTX *in_RCX;
  void *pvVar4;
  long in_R8;
  long in_R9;
  void *__dest;
  Value VVar5;
  Value VVar6;
  
  rVar2.t_ = (Type *)Typelib::Indirect::getIndirection();
  lVar3 = Typelib::Type::getSize();
  pvVar4 = (void *)(in_R8 * lVar3 + *(long *)in_RCX);
  __dest = (void *)((long)src * lVar3 + *(long *)dst);
  iVar1 = Typelib::MemoryLayout::isMemcpy();
  if ((char)iVar1 == '\0') {
    if (in_R9 != 0) {
      do {
        VVar5.m_type.t_ = rVar2.t_;
        VVar5.m_data = __dest;
        VVar6.m_type.t_ = rVar2.t_;
        VVar6.m_data = pvVar4;
        iVar1 = Typelib::copy(VVar5,VVar6);
        pvVar4 = (void *)((long)pvVar4 + lVar3);
        __dest = (void *)((long)__dest + lVar3);
        in_R9 = in_R9 + -1;
      } while (in_R9 != 0);
    }
    return iVar1;
  }
  if (dst != in_RCX) {
    pvVar4 = memcpy(__dest,pvVar4,lVar3 * in_R9);
    return (int)pvVar4;
  }
  pvVar4 = memmove(__dest,pvVar4,lVar3 * in_R9);
  return (int)pvVar4;
}

Assistant:

void Vector::copy(std::vector<uint8_t>* dst_ptr, size_t dst_idx, std::vector<uint8_t>* src_ptr, size_t src_idx, size_t count) const
{
    Type const& element_t = getIndirection();
    size_t element_size = element_t.getSize();
    uint8_t* base_src = &(*src_ptr)[src_idx * element_size];
    uint8_t* base_dst = &(*dst_ptr)[dst_idx * element_size];
    if (isElementMemcpy())
    {
        if (dst_ptr == src_ptr)
            memmove(base_dst, base_src, element_size * count);
        else
            memcpy(base_dst, base_src, element_size * count);
    }
    else
    {
        for (size_t i = 0; i < count; ++i)
        {
            Typelib::copy(
                    Value(base_dst + i * element_size, element_t),
                    Value(base_src + i * element_size, element_t));
        }
    }
}